

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divu_small_test.cc
# Opt level: O0

void __thiscall
DivuSmallTest_TestDIVUrandI31_Test::~DivuSmallTest_TestDIVUrandI31_Test
          (DivuSmallTest_TestDIVUrandI31_Test *this)

{
  void *in_RDI;
  
  ~DivuSmallTest_TestDIVUrandI31_Test((DivuSmallTest_TestDIVUrandI31_Test *)0x509b98);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DivuSmallTest, TestDIVUrandI31) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int d = 1; d < OD_DIVU_DMAX; d++) {
    for (int i = 0; i < 1000000; i++) {
      uint32_t x = rnd.Rand31();
      GTEST_ASSERT_EQ(x / d, OD_DIVU_SMALL(x, d))
          << "x=" << x << " d=" << d << " x/d=" << (x / d)
          << " != " << OD_DIVU_SMALL(x, d);
    }
  }
}